

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O1

void helper_mttdsp_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  CPUMIPSState_conflict5 *pCVar1;
  uint32_t uVar2;
  
  if ((env->CP0_VPEConf0 & 2) == 0) {
    uVar2 = env->current_tc;
  }
  else {
    uVar2 = (uint32_t)
            ((long)(ulong)(byte)env->CP0_VPEControl %
            (long)*(int *)((long)env[-3].tcs[0xc].gpr + 0x94));
  }
  pCVar1 = (CPUMIPSState_conflict5 *)(env->tcs + (int)uVar2);
  if (uVar2 == env->current_tc) {
    pCVar1 = env;
  }
  (pCVar1->active_tc).DSPControl = arg1;
  return;
}

Assistant:

static CPUMIPSState *mips_cpu_map_tc(CPUMIPSState *env, int *tc)
{
    CPUState *cs;
    // int vpe_idx;
    int tc_idx = *tc;

    if (!(env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP))) {
        /* Not allowed to address other CPUs.  */
        *tc = env->current_tc;
        return env;
    }

    cs = env_cpu(env);
    // vpe_idx = tc_idx / cs->nr_threads;
    *tc = tc_idx % cs->nr_threads;
    return env;

#if 0
    MIPSCPU *cpu;
    CPUState *other_cs;
    other_cs = qemu_get_cpu(vpe_idx);
    if (other_cs == NULL) {
        return env;
    }
    cpu = MIPS_CPU(other_cs);
    return &cpu->env;
#endif
}